

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execDivl<(moira::Core)2,(moira::Instr)154,(moira::Mode)2,4>(Moira *this,u16 opcode)

{
  bool bVar1;
  int iVar2;
  bool divByZero;
  bool local_9;
  
  this->cp = 0;
  local_9 = false;
  bVar1 = execDivlMusashi<(moira::Core)2,(moira::Instr)154,(moira::Mode)2,4>(this,opcode,&local_9);
  iVar2 = 0x58;
  if ((bVar1) || (iVar2 = 0x26, local_9 == true)) {
    (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar2 + this->cp));
  }
  return;
}

Assistant:

void
Moira::execDivl(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    bool success;
    bool divByZero = false;

    if constexpr (MOIRA_MIMIC_MUSASHI) {
        success = execDivlMusashi<C, I, M, S>(opcode, &divByZero);
    } else {
        success = execDivlMoira<C, I, M, S>(opcode, &divByZero);
    }

    if (success) {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 84)
        CYCLES_AI   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_PI   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_PD   ( 0,  0,  0,        0,  0,  0,        0,  0, 89)
        CYCLES_DI   ( 0,  0,  0,        0,  0,  0,        0,  0, 89)
        CYCLES_IX   ( 0,  0,  0,        0,  0,  0,        0,  0, 91)
        CYCLES_AW   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_AL   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_DIPC ( 0,  0,  0,        0,  0,  0,        0,  0, 89)
        CYCLES_IXPC ( 0,  0,  0,        0,  0,  0,        0,  0, 91)
        CYCLES_IM   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)

    } else if (divByZero) {

        CYCLES_68000(38);
        CYCLES_68010(44);
        CYCLES_68020(38);
    }

    FINALIZE
}